

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

void gen_b64grams(uint8_t *mem,uint64_t size,TrigramCallback *cb)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint64_t uVar5;
  uint local_3c;
  uint8_t *local_38;
  
  if (3 < size) {
    uVar4 = 0;
    uVar5 = 0;
    uVar3 = 0;
    local_38 = mem;
    do {
      iVar2 = get_b64_value(local_38[uVar5]);
      uVar3 = uVar3 + 1;
      uVar1 = uVar4 * 0x40 + iVar2 & 0xffffff;
      if (iVar2 < 0) {
        uVar1 = uVar4;
        uVar3 = 0;
      }
      uVar4 = uVar1;
      if (3 < uVar3) {
        local_3c = uVar4;
        if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*cb->_M_invoker)((_Any_data *)cb,&local_3c);
      }
      uVar5 = uVar5 + 1;
    } while (size != uVar5);
  }
  return;
}

Assistant:

void gen_b64grams(const uint8_t *mem, uint64_t size,
                  const TrigramCallback &cb) {
    if (size < 4) {
        return;
    }

    uint32_t gram4 = 0;
    uint64_t good_run = 0;

    for (uint64_t offset = 0; offset < size; offset++) {
        int next = get_b64_value(mem[offset]);
        if (next < 0) {
            good_run = 0;
        } else {
            gram4 = ((gram4 << 6U) + next) & 0xFFFFFFU;
            good_run += 1;
        }
        if (good_run >= 4) {
            cb(gram4);
        }
    }
}